

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O3

CURLcode curl_ws_recv(CURL *curl,void *buffer,size_t buflen,size_t *nread,curl_ws_frame **metap)

{
  return CURLE_NOT_BUILT_IN;
}

Assistant:

CURL_EXTERN CURLcode curl_ws_recv(CURL *curl, void *buffer, size_t buflen,
                                  size_t *nread,
                                  const struct curl_ws_frame **metap)
{
  (void)curl;
  (void)buffer;
  (void)buflen;
  (void)nread;
  (void)metap;
  return CURLE_NOT_BUILT_IN;
}